

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O1

string * __thiscall
slang::CommandLine::getHelpText_abi_cxx11_
          (string *__return_storage_ptr__,CommandLine *this,string_view overview)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  element_type *peVar3;
  void *pvVar4;
  size_type __n;
  pointer ppVar5;
  ulong uVar6;
  size_type sVar7;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  ulong uVar8;
  pointer pcVar9;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string key;
  string indent;
  vector<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  lines;
  string local_d8;
  pointer local_b0;
  string local_a8;
  vector<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_88;
  string local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  size_type local_40;
  pointer local_38;
  
  local_a8._M_dataplus._M_p = overview._M_str;
  local_a8._M_string_length = overview._M_len;
  local_48 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_48;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (local_a8._M_string_length != 0) {
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)&local_a8;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0xe;
    ::fmt::v9::vformat_abi_cxx11_(&local_d8,(v9 *)"OVERVIEW: {}\n\n",fmt,args);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  local_a8._M_dataplus._M_p = (this->programName)._M_dataplus._M_p;
  local_a8._M_string_length = (this->programName)._M_string_length;
  args_00.field_1.values_ = in_R9.values_;
  args_00.desc_ = (unsigned_long_long)&local_a8;
  fmt_00.size_ = 0xd;
  fmt_00.data_ = (char *)0x13;
  ::fmt::v9::vformat_abi_cxx11_(&local_d8,(v9 *)"USAGE: {} [options]",fmt_00,args_00);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_d8._M_dataplus._M_p);
  paVar1 = &local_d8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  peVar3 = (this->positional).
           super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3 != (element_type *)0x0) {
    local_a8._M_dataplus._M_p = (peVar3->valueName)._M_dataplus._M_p;
    local_a8._M_string_length = (peVar3->valueName)._M_string_length;
    args_01.field_1.values_ = in_R9.values_;
    args_01.desc_ = (unsigned_long_long)&local_a8;
    fmt_01.size_ = 0xd;
    fmt_01.data_ = (char *)0x6;
    ::fmt::v9::vformat_abi_cxx11_(&local_d8,(v9 *)" {}...",fmt_01,args_01);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_d8._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__,0x3d655d);
  local_88.
  super__Vector_base<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppVar5 = (pointer)(this->orderedOptions).
                    super__Vector_base<std::shared_ptr<slang::CommandLine::Option>,_std::allocator<std::shared_ptr<slang::CommandLine::Option>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  local_b0 = (pointer)(this->orderedOptions).
                      super__Vector_base<std::shared_ptr<slang::CommandLine::Option>,_std::allocator<std::shared_ptr<slang::CommandLine::Option>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar5 == local_b0) {
    sVar7 = 2;
  }
  else {
    uVar6 = 0;
    do {
      peVar3 = ((__shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2> *)
               &ppVar5->first)->_M_ptr;
      pcVar9 = (peVar3->allArgNames)._M_dataplus._M_p;
      local_d8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,pcVar9,pcVar9 + (peVar3->allArgNames)._M_string_length);
      peVar3 = ((__shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2> *)
               &ppVar5->first)->_M_ptr;
      if ((peVar3->valueName)._M_string_length != 0) {
        if (*(peVar3->valueName)._M_dataplus._M_p != '=') {
          std::__cxx11::string::push_back((char)&local_d8);
        }
        std::__cxx11::string::_M_append
                  ((char *)&local_d8,(ulong)(peVar3->valueName)._M_dataplus._M_p);
      }
      if (uVar6 <= local_d8._M_string_length) {
        uVar6 = local_d8._M_string_length;
      }
      local_a8._M_dataplus._M_p =
           (pointer)((__shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2> *)
                    &ppVar5->first)->_M_ptr;
      std::
      vector<std::pair<slang::CommandLine::Option*,std::__cxx11::string>,std::allocator<std::pair<slang::CommandLine::Option*,std::__cxx11::string>>>
      ::emplace_back<slang::CommandLine::Option*,std::__cxx11::string>
                ((vector<std::pair<slang::CommandLine::Option*,std::__cxx11::string>,std::allocator<std::pair<slang::CommandLine::Option*,std::__cxx11::string>>>
                  *)&local_88,(Option **)&local_a8,&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar1) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      ppVar5 = (pointer)&(ppVar5->second)._M_string_length;
    } while (ppVar5 != local_b0);
    sVar7 = uVar6 + 2;
  }
  local_d8._M_dataplus._M_p = " ";
  local_d8._M_string_length = 1;
  args_02.field_1.values_ = in_R9.values_;
  args_02.desc_ = (unsigned_long_long)&local_d8;
  fmt_02.size_ = 0x4d;
  fmt_02.data_ = (char *)0x7;
  local_d8.field_2._M_allocated_capacity = sVar7;
  ::fmt::v9::vformat_abi_cxx11_(&local_a8,(v9 *)"  {:{}}",fmt_02,args_02);
  local_38 = local_88.
             super__Vector_base<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  ppVar5 = local_88.
           super__Vector_base<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_88.
      super__Vector_base<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_88.
      super__Vector_base<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_40 = sVar7;
      local_d8._M_dataplus._M_p = (ppVar5->second)._M_dataplus._M_p;
      local_d8._M_string_length = (ppVar5->second)._M_string_length;
      args_03.field_1.args_ = in_R9.args_;
      args_03.desc_ = (unsigned_long_long)&local_d8;
      fmt_03.size_ = 0x4d;
      fmt_03.data_ = (char *)0x7;
      local_d8.field_2._M_allocated_capacity = local_40;
      ::fmt::v9::vformat_abi_cxx11_(&local_68,(v9 *)"  {:{}}",fmt_03,args_03);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_68._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      uVar6 = (ppVar5->first->desc)._M_string_length;
      local_b0 = ppVar5;
      if (uVar6 != 0) {
        pcVar9 = (ppVar5->first->desc)._M_dataplus._M_p;
        do {
          if (uVar6 == 0) {
            uVar8 = 0xffffffffffffffff;
          }
          else {
            pvVar4 = memchr(pcVar9,10,uVar6);
            uVar8 = -(ulong)(pvVar4 == (void *)0x0) | (long)pvVar4 - (long)pcVar9;
          }
          if (uVar8 == 0xffffffffffffffff) {
            std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)pcVar9);
          }
          else {
            lVar2 = uVar8 + 1;
            std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)pcVar9);
            std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_a8._M_dataplus._M_p);
            if (uVar6 <= uVar8) {
              std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > __size (which is %zu)",
                         "basic_string_view::substr",lVar2,uVar6);
            }
            pcVar9 = pcVar9 + lVar2;
            uVar6 = uVar6 - lVar2;
          }
        } while (uVar8 != 0xffffffffffffffff);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      ppVar5 = local_b0 + 1;
      sVar7 = local_40;
    } while (local_b0 + 1 != local_38);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_88);
  return __return_storage_ptr__;
}

Assistant:

std::string CommandLine::getHelpText(string_view overview) const {
    std::string result;
    if (!overview.empty())
        result = fmt::format("OVERVIEW: {}\n\n"sv, overview);

    result += fmt::format("USAGE: {} [options]"sv, programName);
    if (positional)
        result += fmt::format(" {}...", positional->valueName);

    result += "\n\nOPTIONS:\n"sv;

    // For each option group that takes a value, tack on the value name.
    // Then compute the maximum length of any particular group's key.
    size_t maxLen = 0;
    std::vector<std::pair<Option*, std::string>> lines;
    for (auto& opt : orderedOptions) {
        std::string key = opt->allArgNames;
        std::string& val = opt->valueName;
        if (!val.empty()) {
            if (val[0] != '=')
                key += ' ';
            key += val;
        }

        maxLen = std::max(maxLen, key.length());
        lines.emplace_back(opt.get(), std::move(key));
    }

    // Add two spaces so that the description text is offset from the longest option name.
    maxLen += 2;

    // Finally append all groups to the output.
    std::string indent = fmt::format("  {:{}}"sv, " "sv, maxLen);
    for (auto& [opt, key] : lines) {
        result += fmt::format("  {:{}}"sv, key, maxLen);
        if (!opt->desc.empty()) {
            string_view desc = opt->desc;
            while (true) {
                size_t index = desc.find_first_of('\n');
                if (index == string_view::npos) {
                    result += desc;
                    break;
                }

                result += desc.substr(0, index + 1);
                result += indent;
                desc = desc.substr(index + 1);
            }
        }
        result += "\n";
    }

    return result;
}